

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_> * __thiscall
Json::Reader::getStructuredErrors
          (vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>
           *__return_storage_ptr__,Reader *this)

{
  _Elt_pointer pEVar1;
  _Elt_pointer pEVar2;
  _Elt_pointer pEVar3;
  _Map_pointer ppEVar4;
  StructuredError structured;
  undefined1 local_60 [16];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pEVar3 = (this->errors_).
           super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  pEVar1 = (this->errors_).
           super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pEVar3 != pEVar1) {
    pEVar2 = (this->errors_).
             super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last;
    ppEVar4 = (this->errors_).
              super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
              _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      local_48 = 0;
      local_40._M_local_buf[0] = '\0';
      local_60._0_8_ = (long)(pEVar3->token_).start_ - (long)this->begin_;
      local_60._8_8_ = (long)(pEVar3->token_).end_ - (long)this->begin_;
      local_50._M_p = (pointer)&local_40;
      std::__cxx11::string::_M_assign((string *)&local_50);
      std::vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>::
      push_back(__return_storage_ptr__,(value_type *)local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_p != &local_40) {
        operator_delete(local_50._M_p,
                        CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1)
        ;
      }
      pEVar3 = pEVar3 + 1;
      if (pEVar3 == pEVar2) {
        pEVar3 = ppEVar4[1];
        ppEVar4 = ppEVar4 + 1;
        pEVar2 = pEVar3 + 8;
      }
    } while (pEVar3 != pEVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

bool Reader::parse(std::istream& is, Value& root, bool collectComments) {
  // std::istream_iterator<char> begin(is);
  // std::istream_iterator<char> end;
  // Those would allow streamed input from a file, if parse() were a
  // template function.

  // Since String is reference-counted, this at least does not
  // create an extra copy.
  String doc(std::istreambuf_iterator<char>(is), {});
  return parse(doc.data(), doc.data() + doc.size(), root, collectComments);
}